

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O0

VulkanDynamicAllocation * __thiscall
Diligent::VulkanDynamicHeap::Allocate
          (VulkanDynamicAllocation *__return_storage_ptr__,VulkanDynamicHeap *this,
          Uint32 SizeInBytes,Uint32 Alignment)

{
  bool bVar1;
  Char *pCVar2;
  type tVar3;
  uint *puVar4;
  undefined4 in_register_0000000c;
  char (*Args_1) [80];
  ulong uVar5;
  char (*in_R8) [21];
  undefined1 local_e0 [8];
  string msg_3;
  MasterBlock MasterBlock_1;
  string msg_2;
  MasterBlock MasterBlock;
  OffsetType AlignedSize;
  OffsetType AlignedOffset;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint32 Alignment_local;
  Uint32 SizeInBytes_local;
  VulkanDynamicHeap *this_local;
  
  msg.field_2._8_4_ = Alignment;
  msg.field_2._12_4_ = SizeInBytes;
  if (Alignment == 0) {
    FormatString<char[26],char[14]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcd2283,
               (char (*) [14])CONCAT44(in_register_0000000c,Alignment));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0xe1);
    std::__cxx11::string::~string((string *)local_40);
  }
  bVar1 = IsPowerOfTwo<unsigned_int>(msg.field_2._8_4_);
  if (!bVar1) {
    FormatString<char[12],unsigned_int,char[21]>
              ((string *)&AlignedOffset,(Diligent *)"Alignment (",
               (char (*) [12])((long)&msg.field_2 + 8),(uint *)") must be power of 2",in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0xe2);
    std::__cxx11::string::~string((string *)&AlignedOffset);
  }
  AlignedSize = 0xffffffffffffffff;
  MasterBlock.Size = 0;
  MasterBlock.Size._0_4_ = 0;
  if (this->m_MasterBlockSize >> 1 < (uint)msg.field_2._12_4_) {
    join_0x00000010_0x00000000_ =
         VulkanDynamicMemoryManager::AllocateMasterBlock
                   (this->m_GlobalDynamicMemMgr,(ulong)(uint)msg.field_2._12_4_,
                    (ulong)(uint)msg.field_2._8_4_);
    bVar1 = VariableSizeAllocationsManager::Allocation::IsValid
                      ((Allocation *)((long)&msg_2.field_2 + 8));
    if (bVar1) {
      AlignedSize = AlignUp<unsigned_long,unsigned_long>
                              (msg_2.field_2._8_8_,(ulong)(uint)msg.field_2._8_4_);
      MasterBlock.Size._0_4_ = msg_2._32_4_;
      Args_1 = (char (*) [80])
               ((ulong)(uint)msg.field_2._12_4_ + (AlignedSize - msg_2.field_2._8_8_));
      if (MasterBlock.UnalignedOffset < Args_1) {
        FormatString<char[26],char[80]>
                  ((string *)&MasterBlock_1.Size,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "MasterBlock.Size >= SizeInBytes + (AlignedOffset - MasterBlock.UnalignedOffset)"
                   ,Args_1);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
                   ,0xee);
        std::__cxx11::string::~string((string *)&MasterBlock_1.Size);
      }
      this->m_CurrAllocatedSize = msg_2._32_4_ + this->m_CurrAllocatedSize;
      std::
      vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
      ::emplace_back<Diligent::VariableSizeAllocationsManager::Allocation&>
                ((vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
                  *)&this->m_MasterBlocks,(Allocation *)((long)&msg_2.field_2 + 8));
    }
  }
  else {
    if ((this->m_CurrOffset == 0xffffffffffffffff) ||
       (uVar5 = (ulong)(uint)msg.field_2._12_4_,
       tVar3 = AlignUp<unsigned_long,unsigned_long>
                         (this->m_CurrOffset,(ulong)(uint)msg.field_2._8_4_),
       (ulong)this->m_AvailableSize < uVar5 + (tVar3 - this->m_CurrOffset))) {
      join_0x00000010_0x00000000_ =
           VulkanDynamicMemoryManager::AllocateMasterBlock
                     (this->m_GlobalDynamicMemMgr,(ulong)this->m_MasterBlockSize,0);
      bVar1 = VariableSizeAllocationsManager::Allocation::IsValid
                        ((Allocation *)((long)&msg_3.field_2 + 8));
      if (bVar1) {
        this->m_CurrOffset = msg_3.field_2._8_8_;
        this->m_CurrAllocatedSize = msg_3._32_4_ + this->m_CurrAllocatedSize;
        this->m_AvailableSize = msg_3._32_4_;
        std::
        vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
        ::emplace_back<Diligent::VariableSizeAllocationsManager::Allocation&>
                  ((vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
                    *)&this->m_MasterBlocks,(Allocation *)((long)&msg_3.field_2 + 8));
      }
    }
    if (this->m_CurrOffset != 0xffffffffffffffff) {
      AlignedSize = AlignUp<unsigned_long,unsigned_long>
                              (this->m_CurrOffset,(ulong)(uint)msg.field_2._8_4_);
      MasterBlock.Size = (ulong)(uint)msg.field_2._12_4_ + (AlignedSize - this->m_CurrOffset);
      if (this->m_AvailableSize < MasterBlock.Size) {
        AlignedSize = 0xffffffffffffffff;
      }
      else {
        this->m_AvailableSize = this->m_AvailableSize - (int)MasterBlock.Size;
        this->m_CurrOffset = (MasterBlock.Size & 0xffffffff) + this->m_CurrOffset;
      }
    }
  }
  if (AlignedSize == 0xffffffffffffffff) {
    VulkanDynamicAllocation::VulkanDynamicAllocation(__return_storage_ptr__);
  }
  else {
    this->m_CurrAlignedSize = (int)MasterBlock.Size + this->m_CurrAlignedSize;
    this->m_CurrUsedSize = msg.field_2._12_4_ + this->m_CurrUsedSize;
    puVar4 = std::max<unsigned_int>(&this->m_PeakAlignedSize,&this->m_CurrAlignedSize);
    this->m_PeakAlignedSize = *puVar4;
    puVar4 = std::max<unsigned_int>(&this->m_PeakUsedSize,&this->m_CurrUsedSize);
    this->m_PeakUsedSize = *puVar4;
    puVar4 = std::max<unsigned_int>(&this->m_PeakAllocatedSize,&this->m_CurrAllocatedSize);
    this->m_PeakAllocatedSize = *puVar4;
    if ((AlignedSize & msg.field_2._8_4_ - 1) != 0) {
      FormatString<char[26],char[39]>
                ((string *)local_e0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(AlignedOffset & (Alignment - 1)) == 0",
                 (char (*) [39])(ulong)(msg.field_2._8_4_ - 1));
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
                 ,0x118);
      std::__cxx11::string::~string((string *)local_e0);
    }
    VulkanDynamicAllocation::VulkanDynamicAllocation
              (__return_storage_ptr__,this->m_GlobalDynamicMemMgr,AlignedSize,
               (ulong)(uint)msg.field_2._12_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanDynamicAllocation VulkanDynamicHeap::Allocate(Uint32 SizeInBytes, Uint32 Alignment)
{
    VERIFY_EXPR(Alignment > 0);
    VERIFY(IsPowerOfTwo(Alignment), "Alignment (", Alignment, ") must be power of 2");

    auto       AlignedOffset = InvalidOffset;
    OffsetType AlignedSize   = 0;
    if (SizeInBytes > m_MasterBlockSize / 2)
    {
        // Allocate directly from the memory manager
        auto MasterBlock = m_GlobalDynamicMemMgr.AllocateMasterBlock(SizeInBytes, Alignment);
        if (MasterBlock.IsValid())
        {
            AlignedOffset = AlignUp(MasterBlock.UnalignedOffset, size_t{Alignment});
            AlignedSize   = MasterBlock.Size;
            VERIFY_EXPR(MasterBlock.Size >= SizeInBytes + (AlignedOffset - MasterBlock.UnalignedOffset));
            m_CurrAllocatedSize += static_cast<Uint32>(MasterBlock.Size);
            m_MasterBlocks.emplace_back(MasterBlock);
        }
    }
    else
    {
        if (m_CurrOffset == InvalidOffset || SizeInBytes + (AlignUp(m_CurrOffset, size_t{Alignment}) - m_CurrOffset) > m_AvailableSize)
        {
            auto MasterBlock = m_GlobalDynamicMemMgr.AllocateMasterBlock(m_MasterBlockSize, 0);
            if (MasterBlock.IsValid())
            {
                m_CurrOffset = MasterBlock.UnalignedOffset;
                m_CurrAllocatedSize += static_cast<Uint32>(MasterBlock.Size);
                m_AvailableSize = static_cast<Uint32>(MasterBlock.Size);
                m_MasterBlocks.emplace_back(MasterBlock);
            }
        }

        if (m_CurrOffset != InvalidOffset)
        {
            AlignedOffset = AlignUp(m_CurrOffset, size_t{Alignment});
            AlignedSize   = SizeInBytes + (AlignedOffset - m_CurrOffset);
            if (AlignedSize <= m_AvailableSize)
            {
                m_AvailableSize -= static_cast<Uint32>(AlignedSize);
                m_CurrOffset += static_cast<Uint32>(AlignedSize);
            }
            else
                AlignedOffset = InvalidOffset;
        }
    }

    // Every device context uses its own dynamic heap, so there is no need to lock
    if (AlignedOffset != InvalidOffset)
    {
        m_CurrAlignedSize += static_cast<Uint32>(AlignedSize);
        m_CurrUsedSize += SizeInBytes;
        m_PeakAlignedSize   = std::max(m_PeakAlignedSize, m_CurrAlignedSize);
        m_PeakUsedSize      = std::max(m_PeakUsedSize, m_CurrUsedSize);
        m_PeakAllocatedSize = std::max(m_PeakAllocatedSize, m_CurrAllocatedSize);

        VERIFY_EXPR((AlignedOffset & (Alignment - 1)) == 0);
        return VulkanDynamicAllocation{m_GlobalDynamicMemMgr, AlignedOffset, SizeInBytes};
    }
    else
        return VulkanDynamicAllocation{};
}